

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor> *this,
          CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor> *other)

{
  ChromeThreadDescriptor *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeThreadDescriptor> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeThreadDescriptor,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (ChromeThreadDescriptor *)operator_new(0x38);
  perfetto::protos::gen::ChromeThreadDescriptor::ChromeThreadDescriptor(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeThreadDescriptor,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }